

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O3

void __thiscall pstack::Dwarf::Ranges::Ranges(Ranges *this,DIE *die,uintmax_t base)

{
  pointer *pppVar1;
  iterator __position;
  exception eVar2;
  int iVar3;
  uintmax_t uVar4;
  undefined4 extraout_var;
  Exception *pEVar5;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong len;
  uintmax_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 local_268 [8];
  uchar q;
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  uint local_248;
  undefined1 local_c8 [8];
  Attribute ranges;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  Reader *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  Object *local_78;
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  uint local_48;
  pointer local_40;
  uintmax_t end;
  
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DIE::attribute((Attribute *)local_c8,die,DW_AT_ranges,false);
  if (4 < ((die->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          version) {
    Elf::Section::io((Section *)&local_88);
    end = (uintmax_t)this;
    local_68._0_8_ = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_c8);
    iVar3 = (*local_88->_vptr_Reader[8])();
    local_68._8_8_ = CONCAT44(extraout_var,iVar3);
    local_68._16_8_ = local_88;
    _Stack_50._M_pi = _Stack_80._M_pi;
    local_88 = (Reader *)0x0;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = 8;
    local_78 = (Object *)
               (die->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    len = (ulong)*(byte *)&(local_78->programHeaders)._M_t._M_impl;
    local_70._M_p = (pointer)base;
    do {
      Reader::readObj<unsigned_char>((Reader *)local_68._16_8_,local_68._0_8_,local_268,1);
      local_68._0_8_ = local_68._0_8_ + 1;
      eVar2 = local_268[0];
      switch((ulong)local_268 & 0xff) {
      case 0:
        goto switchD_00134a1d_caseD_0;
      case 1:
        auVar8 = (**(code **)(*(long *)local_68._16_8_ + 0x18))();
        local_68._0_8_ = local_68._0_8_ + auVar8._8_8_;
        local_70._M_p = (pointer)Unit::addrx((Unit *)local_78,auVar8._0_8_);
        break;
      case 2:
        (**(code **)(*(long *)local_68._16_8_ + 0x18))();
        local_68._0_8_ = extraout_RDX + local_68._0_8_;
        (**(code **)(*(long *)local_68._16_8_ + 0x18))();
        local_68._0_8_ = local_68._0_8_ + extraout_RDX_00;
        pEVar5 = (Exception *)__cxa_allocate_exception(0x1a0);
        memset((Exception *)local_268,0,0x1a0);
        Exception::Exception((Exception *)local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&q,"DW_RLE_startx_endx is not handled",0x21);
        Exception::Exception(pEVar5,(Exception *)local_268);
        __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
      case 3:
        auVar8 = (**(code **)(*(long *)local_68._16_8_ + 0x18))();
        local_68._0_8_ = local_68._0_8_ + auVar8._8_8_;
        local_268 = (undefined1  [8])Unit::addrx((Unit *)local_78,auVar8._0_8_);
        auVar8 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar8._8_8_;
        local_40 = (pointer)((long)local_268 + auVar8._0_8_);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)end,(unsigned_long *)local_268,(unsigned_long *)&local_40);
        break;
      case 4:
        auVar8 = (**(code **)(*(long *)local_68._16_8_ + 0x18))();
        local_68._0_8_ = auVar8._8_8_ + local_68._0_8_;
        auVar7 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar7._8_8_;
        local_268 = (undefined1  [8])(local_70._M_p + auVar8._0_8_);
        local_40 = local_70._M_p + auVar7._0_8_;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)end,(unsigned_long *)local_268,(unsigned_long *)&local_40);
        break;
      case 5:
        local_70._M_p = (pointer)DWARFReader::getuint((DWARFReader *)local_68,len);
        break;
      case 6:
        local_268 = (undefined1  [8])DWARFReader::getuint((DWARFReader *)local_68,len);
        local_40 = (pointer)DWARFReader::getuint((DWARFReader *)local_68,len);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)end,(unsigned_long *)local_268,(unsigned_long *)&local_40);
        break;
      case 7:
        local_268 = (undefined1  [8])DWARFReader::getuint((DWARFReader *)local_68,len);
        auVar8 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar8._8_8_;
        local_40 = (pointer)((long)local_268 + auVar8._0_8_);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)end,(unsigned_long *)local_268,(unsigned_long *)&local_40);
        break;
      default:
        pEVar5 = (Exception *)__cxa_allocate_exception(0x1a0);
        memset((Exception *)local_268,0,0x1a0);
        Exception::Exception((Exception *)local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&q,"unhandled DW_RLE_ entry ",0x18);
        std::ostream::operator<<((ostream *)&q,(uint)(byte)eVar2);
        Exception::Exception(pEVar5,(Exception *)local_268);
        __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
      }
    } while( true );
  }
  Elf::Section::io((Section *)&ranges.formp);
  local_268 = (undefined1  [8])DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_c8)
  ;
  _q = (**(code **)(*(long *)ranges.formp + 0x40))();
  local_258 = (element_type *)ranges.formp;
  _Stack_250._M_pi = p_Stack_90;
  ranges.formp = (FormEntry *)0x0;
  local_248 = 8;
  while( true ) {
    uVar6 = base;
    uVar4 = DWARFReader::getuint((DWARFReader *)local_268,8);
    base = DWARFReader::getuint((DWARFReader *)local_268,8);
    if (base == 0 && uVar4 == 0) break;
    if (uVar4 != 0xffffffffffffffff) {
      local_68._0_8_ = uVar4 + uVar6;
      local_68._8_8_ = base + uVar6;
      __position._M_current =
           (this->
           super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->
          super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)this,__position,(pair<unsigned_long,_unsigned_long> *)local_68);
        base = uVar6;
      }
      else {
        (__position._M_current)->first = local_68._0_8_;
        (__position._M_current)->second = local_68._8_8_;
        pppVar1 = &(this->
                   super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
        base = uVar6;
      }
    }
  }
LAB_00134b80:
  if (_Stack_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
  }
  DIE::~DIE((DIE *)local_c8);
  return;
switchD_00134a1d_caseD_0:
  _Stack_250._M_pi = _Stack_50._M_pi;
  goto LAB_00134b80;
}

Assistant:

Ranges::Ranges(const DIE &die, uintmax_t base) {

    auto ranges = die.attribute(DW_AT_ranges);

    if (die.getUnit()->version < 5) {
        // DWARF4 units use debug_ranges
        DWARFReader reader(die.getUnit()->dwarf->debugRanges.io(), uintmax_t(ranges));
        for (;;) {
            auto start = reader.getuint(sizeof (Elf::Addr));
            auto end = reader.getuint(sizeof (Elf::Addr));
            if (start == 0 && end == 0)
                break;
            if (start == std::numeric_limits<Elf::Addr>::max())
                base = end;
            else
                emplace_back(std::make_pair(start + base, end + base));
        }
    } else {
        DWARFReader r(die.getUnit()->dwarf->debugRangelists.io(), uintmax_t(ranges));

        // const auto &elf = die.getUnit()->dwarf->elf;
        // auto &addrs = elf->getDebugSection(".debug_addr", SHT_NULL); // XXX: would be used by the "x" ops below

        auto addrlen = die.getUnit()->addrlen;
        auto &unit = *die.getUnit();
        for (bool done = false; !done;) {
            auto entryType = DW_RLE(r.getu8());
            switch (entryType) {
                case DW_RLE_end_of_list:
                    done = true;
                    break;

                case DW_RLE_base_addressx: {
                    auto baseidx = r.getuleb128();
                    base = unit.addrx(baseidx);
                    break;
                }

                case DW_RLE_startx_endx: {
                    /* auto startx = */ r.getuleb128();
                    /* auto endx = */ r.getuleb128();
                    throw (Exception() << "DW_RLE_startx_endx is not handled");
                }

                case DW_RLE_startx_length: {
                    auto start = unit.addrx(r.getuleb128());
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }

                case DW_RLE_offset_pair: {
                    auto offstart = r.getuleb128();
                    auto offend = r.getuleb128();
                    emplace_back(offstart + base, offend + base);
                    break;
                }

                case DW_RLE_base_address:
                    base = r.getuint(addrlen);
                    break;

                case DW_RLE_start_end: {
                    auto start = r.getuint(addrlen);
                    auto end = r.getuint(addrlen);
                    emplace_back(start, end);
                    break;
                }
                case DW_RLE_start_length: {
                    auto start = r.getuint(addrlen);
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }
                default:
                    throw (Exception() << "unhandled DW_RLE_ entry " << entryType);
            }
        }
    }
}